

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::pollController(RemotelyControlledSampler *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  RemotelyControlledSampler *this_local;
  
  lock._8_8_ = this;
  while ((this->_running & 1U) != 0) {
    updateSampler(this);
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->_mutex);
    std::condition_variable::
    wait_for<long,std::ratio<1l,1000000000l>,jaegertracing::samplers::RemotelyControlledSampler::pollController()::__0>
              (&this->_shutdownCV,(unique_lock<std::mutex> *)local_20,
               &this->_samplingRefreshInterval,(anon_class_8_1_8991fb9c)this);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  }
  return;
}

Assistant:

void RemotelyControlledSampler::pollController()
{
    while (_running) {
        updateSampler();
        std::unique_lock<std::mutex> lock(_mutex);
        _shutdownCV.wait_for(
            lock, _samplingRefreshInterval, [this]() { return !_running; });
    }
}